

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

TPZFMatrix<long_double> * __thiscall
TPZFMatrix<long_double>::operator=(TPZFMatrix<long_double> *this,TPZMatrix<long_double> *A)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble *plVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int64_t iVar11;
  ulong uVar12;
  longdouble in_ST0;
  longdouble lVar13;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  
  lVar8 = (A->super_TPZBaseMatrix).fRow;
  iVar11 = (A->super_TPZBaseMatrix).fCol;
  uVar12 = iVar11 * lVar8;
  plVar7 = this->fElem;
  if (plVar7 != this->fGiven) {
    if (plVar7 != (longdouble *)0x0) {
      operator_delete__(plVar7);
    }
    this->fElem = (longdouble *)0x0;
  }
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = lVar8;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = iVar11;
  if (this->fSize < (long)uVar12) {
    plVar7 = (longdouble *)operator_new__(-(ulong)(uVar12 >> 0x3c != 0) | uVar12 * 0x10);
  }
  else {
    plVar7 = this->fGiven;
  }
  this->fElem = plVar7;
  if (0 < iVar11) {
    lVar9 = 0;
    do {
      if (0 < lVar8) {
        lVar10 = 0;
        lVar13 = in_ST0;
        lVar1 = in_ST1;
        lVar2 = in_ST2;
        lVar3 = in_ST3;
        lVar4 = in_ST4;
        lVar5 = in_ST5;
        lVar6 = in_ST6;
        in_ST6 = in_ST7;
        do {
          in_ST5 = lVar6;
          in_ST4 = lVar5;
          in_ST3 = lVar4;
          in_ST2 = lVar3;
          in_ST1 = lVar2;
          in_ST0 = lVar1;
          (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(A,lVar10,lVar9);
          *plVar7 = lVar13;
          plVar7 = plVar7 + 1;
          lVar10 = lVar10 + 1;
          lVar8 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
          lVar13 = in_ST0;
          lVar1 = in_ST1;
          lVar2 = in_ST2;
          lVar3 = in_ST3;
          lVar4 = in_ST4;
          lVar5 = in_ST5;
          lVar6 = in_ST6;
        } while (lVar10 < lVar8);
        iVar11 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
        in_ST7 = in_ST6;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar11);
  }
  return this;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator=(const TPZMatrix<TVar> &A ) {
    int64_t arows  = A.Rows();
    int64_t acols  = A.Cols();
    int64_t size = arows * acols;
    if(fElem != fGiven) {
        delete []fElem;
        fElem = 0;
    }
    this->fRow  =  arows;
    this->fCol  = acols;
    if(fSize < size) {
        fElem = new TVar[ arows * acols ] ;
    } else {
        fElem = fGiven;
    }
    TVar * dst = fElem;
    for ( int64_t c = 0; c < this->fCol; c++ )
        for ( int64_t r = 0; r < this->fRow; r++ )
            *dst++ = A.Get( r, c );
    return( *this );
}